

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O0

void __thiscall btBU_Simplex1to4::getEdge(btBU_Simplex1to4 *this,int i,btVector3 *pa,btVector3 *pb)

{
  int iVar1;
  btVector3 *pb_local;
  btVector3 *pa_local;
  int i_local;
  btBU_Simplex1to4 *this_local;
  
  iVar1 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74;
  if (iVar1 == 2) {
    *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
    *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
    *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
    *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
  }
  else if (iVar1 == 3) {
    if (i == 0) {
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
    }
    else if (i == 1) {
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
    }
    else if (i == 2) {
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
    }
  }
  else if (iVar1 == 4) {
    switch(i) {
    case 0:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
      break;
    case 1:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
      break;
    case 2:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
      break;
    case 3:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[3].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[3].m_floats + 2);
      break;
    case 4:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[3].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[3].m_floats + 2);
      break;
    case 5:
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
      *(undefined8 *)pb->m_floats = *(undefined8 *)this->m_vertices[3].m_floats;
      *(undefined8 *)(pb->m_floats + 2) = *(undefined8 *)(this->m_vertices[3].m_floats + 2);
    }
  }
  return;
}

Assistant:

void btBU_Simplex1to4::getEdge(int i,btVector3& pa,btVector3& pb) const
{
	
    switch (m_numVertices)
	{

	case 2: 
		pa = m_vertices[0];
		pb = m_vertices[1];
		break;
	case 3:  
		switch (i)
		{
		case 0:
			pa = m_vertices[0];
			pb = m_vertices[1];
			break;
		case 1:
			pa = m_vertices[1];
			pb = m_vertices[2];
			break;
		case 2:
			pa = m_vertices[2];
			pb = m_vertices[0];
			break;

		}
		break;
	case 4: 
		switch (i)
		{
		case 0:
			pa = m_vertices[0];
			pb = m_vertices[1];
			break;
		case 1:
			pa = m_vertices[1];
			pb = m_vertices[2];
			break;
		case 2:
			pa = m_vertices[2];
			pb = m_vertices[0];
			break;
		case 3:
			pa = m_vertices[0];
			pb = m_vertices[3];
			break;
		case 4:
			pa = m_vertices[1];
			pb = m_vertices[3];
			break;
		case 5:
			pa = m_vertices[2];
			pb = m_vertices[3];
			break;
		}

	}




}